

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::print_common_shader_params_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,ShaderNode *shader,uint32_t indent)

{
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [380];
  uint32_t local_1c;
  tinyusdz *ptStack_18;
  uint32_t indent_local;
  ShaderNode *shader_local;
  
  local_1c = (uint32_t)shader;
  ptStack_18 = this;
  shader_local = (ShaderNode *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  print_props(&local_1c8,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(ptStack_18 + 0x6d0),local_1c);
  std::operator<<(aoStack_198,(string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

static std::string print_common_shader_params(const ShaderNode &shader,
                                              const uint32_t indent) {
  std::stringstream ss;

  ss << print_props(shader.props, indent);

  return ss.str();
}